

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

ScriptFunction * __thiscall FBehavior::GetFunction(FBehavior *this,int funcnum,FBehavior **module)

{
  FBehavior **ppFVar1;
  ScriptFunction *funcdef;
  FBehavior **module_local;
  int funcnum_local;
  FBehavior *this_local;
  
  if ((uint)funcnum < (uint)this->NumFunctions) {
    this_local = (FBehavior *)(this->Functions + funcnum);
    if (*(BYTE *)((long)this_local->MapVars + 2) == '\0') {
      *module = this;
    }
    else {
      ppFVar1 = TArray<FBehavior_*,_FBehavior_*>::operator[]
                          (&this->Imports,(long)(int)(*(BYTE *)((long)this_local->MapVars + 2) - 1))
      ;
      this_local = (FBehavior *)GetFunction(*ppFVar1,*(DWORD *)(this_local->MapVars + 1),module);
    }
  }
  else {
    this_local = (FBehavior *)0x0;
  }
  return (ScriptFunction *)this_local;
}

Assistant:

ScriptFunction *FBehavior::GetFunction (int funcnum, FBehavior *&module) const
{
	if ((unsigned)funcnum >= (unsigned)NumFunctions)
	{
		return NULL;
	}
	ScriptFunction *funcdef = (ScriptFunction *)Functions + funcnum;
	if (funcdef->ImportNum)
	{
		return Imports[funcdef->ImportNum - 1]->GetFunction (funcdef->Address, module);
	}
	// Should I just un-const this function instead of using a const_cast?
	module = const_cast<FBehavior *>(this);
	return funcdef;
}